

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1b56d22::GLEnvInfo::GLEnvInfo(GLEnvInfo *this)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  QOpenGLContext *this_00;
  QOpenGLFunctions *pQVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->glversion).d.d = (Data *)0x0;
  (this->glversion).d.ptr = (char *)0x0;
  (this->glrenderer).d.ptr = (char *)0x0;
  (this->glrenderer).d.size = 0;
  (this->glvendor).d.size = 0;
  (this->glrenderer).d.d = (Data *)0x0;
  (this->glvendor).d.d = (Data *)0x0;
  (this->glvendor).d.ptr = (char *)0x0;
  (this->glversion).d.size = 0;
  this_00 = QOpenGLContext::currentContext();
  pQVar3 = QOpenGLContext::functions(this_00);
  pcVar4 = (char *)(*(pQVar3->d_ptr->field_0).functions[0x1a])(0x1f00);
  pcVar5 = (char *)(*(pQVar3->d_ptr->field_0).functions[0x1a])(0x1f01);
  pcVar6 = (char *)(*(pQVar3->d_ptr->field_0).functions[0x1a])(0x1f02);
  if (pcVar4 != (char *)0x0) {
    QByteArray::QByteArray(&local_48,pcVar4,-1);
    pQVar1 = &((this->glvendor).d.d)->super_QArrayData;
    pcVar4 = (this->glvendor).d.ptr;
    *(undefined4 *)&(this->glvendor).d.d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(this->glvendor).d.d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(this->glvendor).d.ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(this->glvendor).d.ptr + 4) = local_48.d.ptr._4_4_;
    qVar2 = (this->glvendor).d.size;
    (this->glvendor).d.size = local_48.d.size;
    local_48.d.d = (Data *)pQVar1;
    local_48.d.ptr = pcVar4;
    local_48.d.size = qVar2;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  if (pcVar5 != (char *)0x0) {
    QByteArray::QByteArray(&local_48,pcVar5,-1);
    pQVar1 = &((this->glrenderer).d.d)->super_QArrayData;
    pcVar4 = (this->glrenderer).d.ptr;
    *(undefined4 *)&(this->glrenderer).d.d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(this->glrenderer).d.d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(this->glrenderer).d.ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(this->glrenderer).d.ptr + 4) = local_48.d.ptr._4_4_;
    qVar2 = (this->glrenderer).d.size;
    (this->glrenderer).d.size = local_48.d.size;
    local_48.d.d = (Data *)pQVar1;
    local_48.d.ptr = pcVar4;
    local_48.d.size = qVar2;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  if (pcVar6 != (char *)0x0) {
    QByteArray::QByteArray(&local_48,pcVar6,-1);
    pQVar1 = &((this->glversion).d.d)->super_QArrayData;
    pcVar4 = (this->glversion).d.ptr;
    *(undefined4 *)&(this->glversion).d.d = local_48.d.d._0_4_;
    *(undefined4 *)((long)&(this->glversion).d.d + 4) = local_48.d.d._4_4_;
    *(undefined4 *)&(this->glversion).d.ptr = local_48.d.ptr._0_4_;
    *(undefined4 *)((long)&(this->glversion).d.ptr + 4) = local_48.d.ptr._4_4_;
    qVar2 = (this->glversion).d.size;
    (this->glversion).d.size = local_48.d.size;
    local_48.d.d = (Data *)pQVar1;
    local_48.d.ptr = pcVar4;
    local_48.d.size = qVar2;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

GLEnvInfo::GLEnvInfo()
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    Q_ASSERT(ctx);
    QOpenGLFunctions *f = ctx->functions();
    const char *vendor = reinterpret_cast<const char *>(f->glGetString(GL_VENDOR));
    const char *renderer = reinterpret_cast<const char *>(f->glGetString(GL_RENDERER));
    const char *version = reinterpret_cast<const char *>(f->glGetString(GL_VERSION));
    if (vendor)
        glvendor = QByteArray(vendor);
    if (renderer)
        glrenderer = QByteArray(renderer);
    if (version)
        glversion = QByteArray(version);
}